

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O0

bool sptk::ReadStream(SymmetricMatrix *matrix_to_read,istream *input_stream)

{
  bool bVar1;
  int iVar2;
  SymmetricMatrix *this;
  SymmetricMatrix *in_RDI;
  int j;
  int i;
  Matrix matrix;
  int dim;
  double *in_stack_ffffffffffffff48;
  int row;
  Matrix *in_stack_ffffffffffffff50;
  istream *input_stream_00;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  Row local_90;
  int local_78;
  int local_74;
  undefined4 local_70;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  Matrix *in_stack_ffffffffffffffa0;
  bool local_1;
  
  if (in_RDI == (SymmetricMatrix *)0x0) {
    local_1 = false;
  }
  else {
    iVar2 = SymmetricMatrix::GetNumDimension(in_RDI);
    input_stream_00 = (istream *)&stack0xffffffffffffffa0;
    Matrix::Matrix(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    bVar1 = ReadStream((Matrix *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                       input_stream_00);
    if (bVar1) {
      for (local_74 = 0; local_74 < iVar2; local_74 = local_74 + 1) {
        for (local_78 = 0; local_78 <= local_74; local_78 = local_78 + 1) {
          row = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
          this = (SymmetricMatrix *)Matrix::operator[](in_stack_ffffffffffffff50,row);
          in_stack_ffffffffffffff50 = (Matrix *)(&this->_vptr_SymmetricMatrix)[local_78];
          SymmetricMatrix::operator[](this,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
          in_stack_ffffffffffffff48 =
               SymmetricMatrix::Row::operator[]((Row *)in_stack_ffffffffffffff50,row);
          *in_stack_ffffffffffffff48 = (double)in_stack_ffffffffffffff50;
          SymmetricMatrix::Row::~Row(&local_90);
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
    local_70 = 1;
    Matrix::~Matrix(in_stack_ffffffffffffff50);
  }
  return local_1;
}

Assistant:

bool ReadStream(sptk::SymmetricMatrix* matrix_to_read,
                std::istream* input_stream) {
  if (NULL == matrix_to_read) {
    return false;
  }

  const int dim(matrix_to_read->GetNumDimension());
  sptk::Matrix matrix(dim, dim);
  if (!sptk::ReadStream(&matrix, input_stream)) {
    return false;
  }

  for (int i(0); i < dim; ++i) {
    for (int j(0); j <= i; ++j) {
      (*matrix_to_read)[i][j] = matrix[i][j];
    }
  }

  return true;
}